

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointcloud.cpp
# Opt level: O2

uint __thiscall ON_PointCloud::HiddenPointUnsignedCount(ON_PointCloud *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = this->m_hidden_count;
  uVar3 = 0;
  if (((uVar1 != 0) &&
      (uVar2 = (this->m_P).super_ON_SimpleArray<ON_3dPoint>.m_count, uVar3 = 0, uVar1 <= uVar2)) &&
     (uVar3 = 0, (this->m_H).m_count == uVar2)) {
    uVar3 = uVar1;
  }
  return uVar3;
}

Assistant:

unsigned int ON_PointCloud::HiddenPointUnsignedCount() const
{
  unsigned int point_count;
  return (    m_hidden_count > 0 
           && (point_count = m_P.UnsignedCount()) > 0
           && m_hidden_count <= point_count 
           && m_H.UnsignedCount() == point_count 
           )
           ? m_hidden_count
           : 0;
}